

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Map<asl::String,_int>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::operator=
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,
          Array<asl::Map<asl::String,_int>::KeyVal> *b)

{
  int *piVar1;
  KeyVal *pKVar2;
  
  if (this->_a != b->_a) {
    LOCK();
    piVar1 = &this->_a[-1].value;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(this,b);
    }
    pKVar2 = b->_a;
    this->_a = pKVar2;
    LOCK();
    piVar1 = &pKVar2[-1].value;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}